

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsLinuxELFLinker::ScanDependencies
          (cmBinUtilsLinuxELFLinker *this,string *file,TargetType param_2)

{
  bool bVar1;
  uint16_t uVar2;
  char *fname;
  allocator<char> local_99;
  string local_98;
  undefined4 local_78;
  undefined1 local_68 [8];
  cmELF elf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parentRpaths;
  TargetType param_2_local;
  string *file_local;
  cmBinUtilsLinuxELFLinker *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&elf.ErrorMessage.field_2 + 8));
  fname = (char *)std::__cxx11::string::c_str();
  cmELF::cmELF((cmELF *)local_68,fname);
  bVar1 = cmELF::operator_cast_to_bool((cmELF *)local_68);
  if (bVar1) {
    uVar2 = cmELF::GetMachine((cmELF *)local_68);
    if (uVar2 != 0) {
      if (this->Machine == 0) {
        uVar2 = cmELF::GetMachine((cmELF *)local_68);
        this->Machine = uVar2;
      }
      else {
        uVar2 = cmELF::GetMachine((cmELF *)local_68);
        if (uVar2 != this->Machine) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"All files must have the same architecture.",&local_99);
          cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::allocator<char>::~allocator(&local_99);
          this_local._7_1_ = false;
          goto LAB_0088252e;
        }
      }
    }
    this_local._7_1_ =
         ScanDependencies(this,file,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&elf.ErrorMessage.field_2 + 8));
  }
  else {
    this_local._7_1_ = false;
  }
LAB_0088252e:
  local_78 = 1;
  cmELF::~cmELF((cmELF *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&elf.ErrorMessage.field_2 + 8));
  return this_local._7_1_;
}

Assistant:

bool cmBinUtilsLinuxELFLinker::ScanDependencies(
  std::string const& file, cmStateEnums::TargetType /* unused */)
{
  std::vector<std::string> parentRpaths;

  cmELF elf(file.c_str());
  if (!elf) {
    return false;
  }
  if (elf.GetMachine() != 0) {
    if (this->Machine != 0) {
      if (elf.GetMachine() != this->Machine) {
        this->SetError("All files must have the same architecture.");
        return false;
      }
    } else {
      this->Machine = elf.GetMachine();
    }
  }

  return this->ScanDependencies(file, parentRpaths);
}